

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Peers.cpp
# Opt level: O2

int __thiscall Peers::connect(Peers *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  ushort uVar1;
  int iVar2;
  Socket __fd_00;
  undefined8 extraout_RAX;
  undefined4 in_register_00000034;
  char *pcVar3;
  ostream *poVar4;
  SocketResource socket;
  unique_ptr<Peer,_std::default_delete<Peer>_> local_40;
  unique_ptr<Peer,_std::default_delete<Peer>_> peer;
  Socket local_2c;
  sockaddr_in addr;
  
  uVar1 = (ushort)__addr;
  if (uVar1 < 1000) {
    poVar4 = (ostream *)&std::cout;
    pcVar3 = "Invalid remote peer port\n";
  }
  else {
    socket = SocketResource::create();
    addr.sin_family = 2;
    addr.sin_port = uVar1 << 8 | uVar1 >> 8;
    iVar2 = inet_pton(2,*(char **)CONCAT44(in_register_00000034,__fd),&addr.sin_addr);
    if (iVar2 < 1) {
      poVar4 = (ostream *)&std::cout;
      pcVar3 = "Peers: Invalid IPv4 host address\n";
    }
    else {
      __fd_00 = SocketResource::resource(&socket);
      iVar2 = ::connect(__fd_00,(sockaddr *)&addr,0x10);
      if (iVar2 == 0) {
        local_2c = socket.m_socket;
        std::make_unique<Peer,P2PSocket*&,SocketResource,int>
                  ((P2PSocket **)&peer,(SocketResource *)&this->m_p2pSocket,&local_2c);
        local_40 = (unique_ptr<Peer,_std::default_delete<Peer>_>)
                   (unique_ptr<Peer,_std::default_delete<Peer>_>)
                   peer._M_t.super___uniq_ptr_impl<Peer,_std::default_delete<Peer>_>._M_t.
                   super__Tuple_impl<0UL,_Peer_*,_std::default_delete<Peer>_>.
                   super__Head_base<0UL,_Peer_*,_false>._M_head_impl;
        peer._M_t.super___uniq_ptr_impl<Peer,_std::default_delete<Peer>_>._M_t.
        super__Tuple_impl<0UL,_Peer_*,_std::default_delete<Peer>_>.
        super__Head_base<0UL,_Peer_*,_false>._M_head_impl =
             (__uniq_ptr_data<Peer,_std::default_delete<Peer>,_true,_true>)
             (__uniq_ptr_impl<Peer,_std::default_delete<Peer>_>)0x0;
        peerIsConnected(this,&local_40);
        std::unique_ptr<Peer,_std::default_delete<Peer>_>::~unique_ptr(&local_40);
        std::unique_ptr<Peer,_std::default_delete<Peer>_>::~unique_ptr(&peer);
        return (int)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
      }
      poVar4 = std::operator<<((ostream *)&std::cout,"Peer connection to ");
      poVar4 = std::operator<<(poVar4,(string *)CONCAT44(in_register_00000034,__fd));
      poVar4 = std::operator<<(poVar4," on port ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar1);
      pcVar3 = " failed";
    }
  }
  std::operator<<(poVar4,pcVar3);
  return 0;
}

Assistant:

bool Peers::connect(const std::string &remotePeerAddr, uint16_t port)
{
    if (port < 0x3E8 || port > 0xFFFF) {
        std::cout << "Invalid remote peer port\n";
        return false;
    }
    auto socket = SocketResource::create();

    sockaddr_in addr;
    addr.sin_family = AF_INET;
    addr.sin_port = htons(port);
#ifdef _WIN32
    auto ipAddr = ::inet_addr(remotePeerAddr.c_str());
    if (ipAddr == INADDR_NONE)
        return false;
    if (ipAddr == INADDR_ANY)
        return false;
    address.sin_addr.s_addr = ipAddr;
#else
    if (::inet_pton(AF_INET, remotePeerAddr.c_str(), &addr.sin_addr) <= 0) {
        std::cout << "Peers: Invalid IPv4 host address\n";
        return false;
    }
#endif
    if (::connect(socket.resource(), (struct sockaddr *)&addr, sizeof(addr)) != NO_ERROR) {
        std::cout << "Peer connection to " << remotePeerAddr << " on port " << port << " failed";
        return false;
    }

    std::unique_ptr<Peer> peer = std::make_unique<Peer>(m_p2pSocket, SocketResource(socket), 0);
    peerIsConnected(std::move(peer));
    return true;
}